

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O3

StrategyConfig * readoptions(StrategyConfig *__return_storage_ptr__,int argc,char **argv)

{
  size_t *psVar1;
  char **ppcVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  StrategyConfig *pSVar7;
  char cVar8;
  int iVar9;
  istream *piVar10;
  int *piVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  char *pcVar14;
  size_t sVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  ostream *poVar17;
  undefined8 uVar18;
  string *psVar19;
  char *pcVar20;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  string line;
  ifstream input;
  allocator local_4a9;
  StrategyConfig *local_4a8;
  int local_49c;
  _List_node_base *local_498;
  int local_48c;
  char **local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_480 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  char **local_460;
  _List_node_base local_458;
  undefined8 local_448;
  undefined1 local_440 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  uint auStack_418 [120];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238);
  local_448 = 0;
  __return_storage_ptr__->_vptr_StrategyConfig = (_func_int **)&PTR__StrategyConfig_00117d60;
  __return_storage_ptr__->compress = false;
  __return_storage_ptr__->detailed = false;
  __return_storage_ptr__->specific = false;
  __return_storage_ptr__->both = false;
  local_458._M_next = &local_458;
  local_458._M_prev = &local_458;
  std::__cxx11::
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::list(&__return_storage_ptr__->ranges,
         (list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *)&local_458);
  __return_storage_ptr__->dump = (char *)0x0;
  __return_storage_ptr__->input1 = (char *)0x0;
  __return_storage_ptr__->instrs = (char *)0x0;
  __return_storage_ptr__->output = (char *)0x0;
  __return_storage_ptr__->input2 = (char *)0x0;
  local_4a8 = __return_storage_ptr__;
  local_48c = argc;
  local_488 = argv;
  p_Var12 = local_458._M_next;
  while (p_Var12 != &local_458) {
    p_Var13 = (((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var12);
    p_Var12 = p_Var13;
  }
  local_460 = &local_4a8->instrs;
  do {
    iVar9 = getopt(local_48c,local_488,":cps:br:a:A:i:o:d:");
    pSVar7 = local_4a8;
    pcVar14 = _optarg;
    switch(iVar9) {
    case 0x61:
      iVar9 = strncasecmp(_optarg,"0x",2);
      if (iVar9 != 0) {
        pcVar14 = pcVar14 + 2;
        _optarg = pcVar14;
      }
      std::__cxx11::string::string((string *)local_440,pcVar14,&local_4a9);
      uVar18 = local_440._0_8_;
      piVar11 = __errno_location();
      local_498 = (_List_node_base *)CONCAT44(local_498._4_4_,*piVar11);
      *piVar11 = 0;
      p_Var12 = (_List_node_base *)strtoul((char *)uVar18,(char **)local_480,0x10);
      if (local_480[0] ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar18) {
        std::__throw_invalid_argument("stoul");
LAB_0010ffa5:
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x20);
        local_440._0_8_ = local_440 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"invalid range: ","");
        std::operator+(pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_440,_optarg);
        __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      if (*piVar11 == 0) {
        *piVar11 = (int)local_498;
      }
      else {
        __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&optarg;
        if (*piVar11 == 0x22) {
LAB_0011008b:
          std::__throw_out_of_range("stoul");
          goto LAB_00110097;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_440 + 0x10)) {
        operator_delete((void *)local_440._0_8_);
      }
      if (p_Var12 != (_List_node_base *)0x0) {
        p_Var13 = (_List_node_base *)operator_new(0x20);
        p_Var13[1]._M_next = p_Var12;
LAB_0010fdb6:
        p_Var13[1]._M_prev = p_Var12;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        psVar1 = &(local_4a8->ranges).
                  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      break;
    case 0x62:
      local_4a8->both = true;
      break;
    case 99:
      local_4a8->compress = true;
      break;
    case 100:
      local_4a8->dump = _optarg;
      break;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x71:
switchD_0010f902_caseD_65:
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x20);
      local_440._0_8_ = local_440 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Invalid option: ","");
      std::operator+(pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_440,optopt);
      __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    case 0x69:
      *local_460 = _optarg;
      break;
    case 0x6f:
      local_4a8->output = _optarg;
      break;
    case 0x70:
      local_4a8->detailed = true;
      break;
    case 0x72:
      pcVar14 = strchr(_optarg,0x3a);
      if (pcVar14 == (char *)0x0) goto LAB_0010ffa5;
      *pcVar14 = '\0';
      pcVar20 = _optarg;
      iVar9 = strncasecmp(_optarg,"0x",2);
      if (iVar9 != 0) {
        pcVar20 = pcVar20 + 2;
        _optarg = pcVar20;
      }
      iVar9 = strncasecmp(pcVar14 + 1,"0x",2);
      __s = pcVar14 + 3;
      if (iVar9 == 0) {
        __s = pcVar14 + 1;
      }
      std::__cxx11::string::string((string *)local_440,pcVar20,&local_4a9);
      __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_440._0_8_;
      piVar11 = __errno_location();
      local_49c = *piVar11;
      *piVar11 = 0;
      local_498 = (_List_node_base *)strtoul(__nptr->_M_local_buf,(char **)local_480,0x10);
      if (local_480[0] == __nptr) {
        std::__throw_invalid_argument("stoul");
      }
      else {
        if (*piVar11 != 0) {
          if (*piVar11 != 0x22) goto LAB_0010fcf3;
          std::__throw_out_of_range("stoul");
LAB_0011007f:
          std::__throw_out_of_range("stoul");
          goto LAB_0011008b;
        }
        *piVar11 = local_49c;
LAB_0010fcf3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_440 + 0x10)) {
          operator_delete((void *)local_440._0_8_);
        }
        local_440._0_8_ = local_440 + 0x10;
        sVar15 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_440,__s,__s + sVar15);
        uVar18 = local_440._0_8_;
        local_49c = *piVar11;
        *piVar11 = 0;
        p_Var12 = (_List_node_base *)strtoul((char *)local_440._0_8_,(char **)local_480,0x10);
        if (local_480[0] !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar18) {
          __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&optarg;
          if (*piVar11 == 0) {
            *piVar11 = local_49c;
          }
          else if (*piVar11 == 0x22) goto LAB_0011007f;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_440 + 0x10)) {
            operator_delete((void *)local_440._0_8_);
          }
          if (p_Var12 < local_498) goto LAB_0010fef1;
          p_Var13 = (_List_node_base *)operator_new(0x20);
          p_Var13[1]._M_next = local_498;
          goto LAB_0010fdb6;
        }
      }
      std::__throw_invalid_argument("stoul");
LAB_0010fef1:
      std::__cxx11::stringstream::stringstream((stringstream *)local_440);
      lVar3 = *(long *)(CONCAT71(local_430._M_allocated_capacity._1_7_,local_430._M_local_buf[0]) +
                       -0x18);
      *(uint *)((long)auStack_418 + lVar3) = *(uint *)((long)auStack_418 + lVar3) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_440 + 0x10),"invalid range: ",0xf);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)(local_440 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," < ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      uVar18 = __cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      __cxa_throw(uVar18,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    case 0x73:
      iVar9 = strcasecmp(_optarg,"simple");
      if (iVar9 == 0) {
        local_4a8->specific = false;
      }
      else {
        iVar9 = strcasecmp(pcVar14,"specific");
        if (iVar9 != 0) {
          pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          local_440._0_8_ = local_440 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_440,"Invalid strategy: ","");
          std::operator+(pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_440,_optarg);
          __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        local_4a8->specific = true;
      }
      break;
    default:
      if (iVar9 != 0x41) {
        if (iVar9 == -1) {
          __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&optind;
          if (_optind + 1 < local_48c) {
            iVar9 = _optind + 2;
            ppcVar2 = local_488 + _optind;
            uVar4 = *(undefined4 *)((long)ppcVar2 + 4);
            uVar5 = *(undefined4 *)(ppcVar2 + 1);
            uVar6 = *(undefined4 *)((long)ppcVar2 + 0xc);
            _optind = iVar9;
            *(undefined4 *)&local_4a8->input1 = *(undefined4 *)ppcVar2;
            *(undefined4 *)((long)&local_4a8->input1 + 4) = uVar4;
            *(undefined4 *)&local_4a8->input2 = uVar5;
            *(undefined4 *)((long)&local_4a8->input2 + 4) = uVar6;
            if (local_48c <= iVar9) {
              if ((local_4a8->both == false) && (local_4a8->specific == true)) {
                psVar19 = (string *)__cxa_allocate_exception(0x20);
                *(string **)psVar19 = psVar19 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          (psVar19,"-b must be used with specific strategy","");
                __cxa_throw(psVar19,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              std::ifstream::~ifstream(local_238);
              return pSVar7;
            }
            goto LAB_001100a4;
          }
LAB_00110097:
          usage(*local_488);
LAB_001100a4:
          pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          local_440._0_8_ = local_440 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_440,"Unknown extra option: ","");
          std::operator+(pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_440,local_488[*(int *)__nptr]);
          __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        goto switchD_0010f902_caseD_65;
      }
      std::ifstream::ifstream((string *)local_440,_optarg,_S_in);
      std::ifstream::operator=(local_238,(ifstream *)local_440);
      std::ifstream::~ifstream((string *)local_440);
      local_440._0_8_ = local_440 + 0x10;
      local_440._8_8_ = 0;
      local_430._M_local_buf[0] = '\0';
      while( true ) {
        cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)local_440,cVar8);
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
        trim((string *)local_440);
        if ((1 < (ulong)local_440._8_8_) &&
           (iVar9 = std::__cxx11::string::compare((ulong)local_440,0,(char *)0x2), iVar9 != 0)) {
          std::__cxx11::string::substr((ulong)local_480,(ulong)local_440);
          std::__cxx11::string::operator=((string *)local_440,(string *)local_480);
          if (local_480[0] != &local_470) {
            operator_delete(local_480[0]);
          }
        }
        uVar18 = local_440._0_8_;
        if (local_440._8_8_ != 0) {
          piVar11 = __errno_location();
          iVar9 = *piVar11;
          *piVar11 = 0;
          p_Var12 = (_List_node_base *)strtoul((char *)uVar18,(char **)local_480,0x10);
          if (local_480[0] ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar18) {
            std::__throw_invalid_argument("stoul");
LAB_0010fe66:
            std::__throw_out_of_range("stoul");
            goto switchD_0010f902_caseD_65;
          }
          if (*piVar11 == 0) {
            *piVar11 = iVar9;
          }
          else if (*piVar11 == 0x22) goto LAB_0010fe66;
          if (p_Var12 != (_List_node_base *)0x0) {
            p_Var13 = (_List_node_base *)operator_new(0x20);
            p_Var13[1]._M_next = p_Var12;
            p_Var13[1]._M_prev = p_Var12;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            psVar1 = &(local_4a8->ranges).
                      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_440 + 0x10)) {
        operator_delete((void *)local_440._0_8_);
      }
      std::ifstream::close();
    }
  } while( true );
}

Assistant:

StrategyConfig readoptions(int argc, char* argv[]) {
	int opt;
	char* idx;
	Addr start, end;
	std::ifstream input;
	StrategyConfig config;

	while ((opt = getopt(argc, argv, ":cps:br:a:A:i:o:d:")) != -1) {
		switch (opt) {
			case 'c':
				config.compress = true;
				break;
			case 'p':
				config.detailed = true;
				break;
			case 's':
				if (strcasecmp(optarg, "simple") == 0)
					config.specific = false;
				else if (strcasecmp(optarg, "specific") == 0)
					config.specific = true;
				else
					throw std::string("Invalid strategy: ") + optarg;
				break;
			case 'b':
				config.both = true;
				break;
			case 'r':
				idx = strchr(optarg, ':');
				if (!idx)
					throw std::string("invalid range: ") + optarg;

				*idx = 0;
				idx++;

				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;
				if (strncasecmp(idx, "0x", 2))
					idx += 2;

				start = std::stoul(optarg, 0, 16);
				end = std::stoul(idx, 0, 16);

				if (end < start) {
					std::stringstream ss;
					ss << std::hex;
					ss << "invalid range: " << end << " < " << start;

					throw ss.str();
				}

				config.ranges.push_back(std::make_pair(start, end));
				break;
			case 'a':
				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;

				start = std::stoul(optarg, 0, 16);
				if (start != 0)
					config.ranges.push_back(std::make_pair(start, start));
				break;
			case 'A':
				input = std::ifstream(optarg);
				for (std::string line; getline(input, line); ) {
					trim(line);

					if (line.length() >= 2 && line.compare(0, 2, "0x"))
						line = line.substr(2);

					if (line.empty())
						continue;

					start = std::stoul(line, 0, 16);
					if (start != 0)
						config.ranges.push_back(std::make_pair(start, start));
				}
				input.close();

				break;
			case 'i':
				config.instrs = optarg;
				break;
			case 'o':
				config.output = optarg;
				break;
			case 'd':
				config.dump = optarg;
				break;
			default:
				throw std::string("Invalid option: ") + (char) optopt;
		}
	}

	if (optind+1 >= argc)
		usage(argv[0]);

	config.input1 = argv[optind++];
	config.input2 = argv[optind++];

	if (optind < argc)
		throw std::string("Unknown extra option: ") + argv[optind];

	if (!config.both && config.specific)
		throw std::string("-b must be used with specific strategy");

	return config;
}